

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-title.c
# Opt level: O3

int run_test_process_title(void)

{
  int iVar1;
  int extraout_EAX;
  uint uVar2;
  int extraout_EAX_00;
  uv_loop_t *loop;
  uv_loop_t *loop_00;
  int extraout_EDX;
  uv_process_t *process;
  char *pcVar3;
  char *pcVar4;
  char *title;
  uv_handle_t *handle;
  uv_handle_t auStack_c48 [2];
  uv_loop_t *puStack_b40;
  undefined1 auStack_b20 [24];
  uv_close_cb p_Stack_b08;
  uv_close_cb p_Stack_b00;
  void *pvStack_af8;
  uv_process_options_t uStack_af0;
  uv_process_t uStack_ab0;
  undefined1 auStack_a28 [511];
  undefined1 uStack_829;
  uv_loop_t uStack_828;
  char *pcStack_428;
  char acStack_410 [512];
  char acStack_208 [520];
  
  pcVar4 = acStack_208;
  title = acStack_208;
  set_title("%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s");
  set_title("new title");
  pcVar3 = (char *)0x0;
  iVar1 = uv_get_process_title((char *)0x0,100);
  if (iVar1 == -0x16) {
    iVar1 = uv_get_process_title(acStack_208,0);
    pcVar3 = pcVar4;
    if (iVar1 != -0x16) goto LAB_00165b80;
    iVar1 = uv_get_process_title(acStack_208,1);
    if (iVar1 == -0x69) {
      return 0;
    }
  }
  else {
    run_test_process_title_cold_1();
LAB_00165b80:
    title = pcVar3;
    run_test_process_title_cold_2();
  }
  run_test_process_title_cold_3();
  iVar1 = uv_get_process_title(acStack_410,0x200);
  if (iVar1 == 0) {
    iVar1 = uv_set_process_title(title);
    if (iVar1 != 0) goto LAB_00165be0;
    iVar1 = uv_get_process_title(acStack_410,0x200);
    if (iVar1 != 0) goto LAB_00165be5;
    iVar1 = strcmp(acStack_410,title);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    set_title_cold_1();
LAB_00165be0:
    set_title_cold_2();
LAB_00165be5:
    set_title_cold_3();
  }
  set_title_cold_4();
  process = (uv_process_t *)auStack_b20;
  auStack_b20._0_8_ = (void *)0x3ff;
  loop_00 = &uStack_828;
  loop = loop_00;
  pcStack_428 = title;
  iVar1 = uv_exepath((char *)loop_00,(size_t *)process);
  if (iVar1 == 0) {
    *(undefined1 *)(auStack_b20._0_8_ + (long)(uStack_828.handle_queue + -2)) = 0;
    memset(auStack_a28,0x78,0x1ff);
    uStack_829 = 0;
    uStack_af0.args = (char **)(auStack_b20 + 8);
    auStack_b20._16_8_ = "process_title_big_argv_helper";
    pvStack_af8 = (void *)0x0;
    uStack_af0.env = (char **)0x0;
    uStack_af0.cwd = (char *)0x0;
    uStack_af0.flags = 0;
    uStack_af0.stdio_count = 0;
    uStack_af0.stdio = (uv_stdio_container_t *)0x0;
    uStack_af0.uid = 0;
    uStack_af0.gid = 0;
    uStack_af0.exit_cb = exit_cb;
    auStack_b20._8_8_ = loop_00;
    p_Stack_b08 = (uv_close_cb)auStack_a28;
    p_Stack_b00 = (uv_close_cb)auStack_a28;
    uStack_af0.file = (char *)loop_00;
    loop = uv_default_loop();
    process = &uStack_ab0;
    iVar1 = uv_spawn(loop,process,&uStack_af0);
    if (iVar1 != 0) goto LAB_00165d0b;
    loop = uv_default_loop();
    process = (uv_process_t *)0x0;
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar1 == 0) {
      loop_00 = uv_default_loop();
      uv_walk(loop_00,close_walk_cb,(void *)0x0);
      process = (uv_process_t *)0x0;
      uv_run(loop_00,UV_RUN_DEFAULT);
      loop = uv_default_loop();
      iVar1 = uv_loop_close(loop);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00165d15;
    }
  }
  else {
    run_test_process_title_big_argv_cold_1();
LAB_00165d0b:
    run_test_process_title_big_argv_cold_2();
  }
  run_test_process_title_big_argv_cold_3();
LAB_00165d15:
  run_test_process_title_big_argv_cold_4();
  if (process == (uv_process_t *)0x0) {
    if (extraout_EDX == 0) {
      uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
      return extraout_EAX;
    }
  }
  else {
    exit_cb_cold_1();
  }
  exit_cb_cold_2();
  handle = auStack_c48;
  puStack_b40 = loop_00;
  memset(auStack_c48,0,0x100);
  auStack_c48[0].data._0_4_ = 0x6c696166;
  uv_get_process_title((char *)auStack_c48,0x100);
  uVar2 = (uint)auStack_c48[0].data._4_1_ | (uint)auStack_c48[0].data ^ 0x6c696166;
  if (uVar2 != 0) {
    return uVar2;
  }
  process_title_big_argv_cold_1();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(process_title) {
#if defined(__sun) || defined(__CYGWIN__) || defined(__MSYS__) || \
    defined(__PASE__)
  RETURN_SKIP("uv_(get|set)_process_title is not implemented.");
#endif

  /* Check for format string vulnerabilities. */
  set_title("%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s");
  set_title("new title");

  /* Check uv_get_process_title() edge cases */
  uv_get_process_title_edge_cases();

  return 0;
}